

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiView.cpp
# Opt level: O2

ChannelList *
Imf_3_4::channelsInNoView
          (ChannelList *__return_storage_ptr__,ChannelList *channelList,StringVector *multiView)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  channelsInView(__return_storage_ptr__,&local_40,channelList,multiView);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

ChannelList
channelsInNoView (const ChannelList& channelList, const StringVector& multiView)
{
    //
    // Return a list of channels not associated with any named view.
    //

    return channelsInView ("", channelList, multiView);
}